

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *this)

{
  DeclarationData *pDVar1;
  
  pDVar1 = (this->d).ptr;
  if (pDVar1 != (DeclarationData *)0x0) {
    LOCK();
    (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pDVar1 = (this->d).ptr;
      if (pDVar1 != (DeclarationData *)0x0) {
        QCss::Declaration::DeclarationData::~DeclarationData(pDVar1);
      }
      operator_delete(pDVar1,0x68);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }